

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_BOOL qpdf_more_warnings(qpdf_data qpdf)

{
  string *psVar1;
  bool bVar2;
  element_type *this;
  iterator __first;
  iterator __last;
  undefined1 local_30 [8];
  vector<QPDFExc,_std::allocator<QPDFExc>_> w;
  qpdf_data qpdf_local;
  
  w.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_more_warnings",0);
  bVar2 = std::__cxx11::list<QPDFExc,_std::allocator<QPDFExc>_>::empty
                    ((list<QPDFExc,_std::allocator<QPDFExc>_> *)
                     &((w.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage)->object)._M_string_length);
  if (bVar2) {
    this = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      w.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    QPDF::getWarnings((vector<QPDFExc,_std::allocator<QPDFExc>_> *)local_30,this);
    bVar2 = std::vector<QPDFExc,_std::allocator<QPDFExc>_>::empty
                      ((vector<QPDFExc,_std::allocator<QPDFExc>_> *)local_30);
    if (!bVar2) {
      psVar1 = &(w.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage)->object;
      __first = std::vector<QPDFExc,_std::allocator<QPDFExc>_>::begin
                          ((vector<QPDFExc,_std::allocator<QPDFExc>_> *)local_30);
      __last = std::vector<QPDFExc,_std::allocator<QPDFExc>_>::end
                         ((vector<QPDFExc,_std::allocator<QPDFExc>_> *)local_30);
      std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
      assign<__gnu_cxx::__normal_iterator<QPDFExc*,std::vector<QPDFExc,std::allocator<QPDFExc>>>,void>
                ((list<QPDFExc,std::allocator<QPDFExc>> *)&psVar1->_M_string_length,
                 (__normal_iterator<QPDFExc_*,_std::vector<QPDFExc,_std::allocator<QPDFExc>_>_>)
                 __first._M_current,
                 (__normal_iterator<QPDFExc_*,_std::vector<QPDFExc,_std::allocator<QPDFExc>_>_>)
                 __last._M_current);
    }
    std::vector<QPDFExc,_std::allocator<QPDFExc>_>::~vector
              ((vector<QPDFExc,_std::allocator<QPDFExc>_> *)local_30);
  }
  bVar2 = std::__cxx11::list<QPDFExc,_std::allocator<QPDFExc>_>::empty
                    ((list<QPDFExc,_std::allocator<QPDFExc>_> *)
                     &((w.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage)->object)._M_string_length);
  qpdf_local._4_4_ = (uint)!bVar2;
  return qpdf_local._4_4_;
}

Assistant:

QPDF_BOOL
qpdf_more_warnings(qpdf_data qpdf)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_more_warnings");

    if (qpdf->warnings.empty()) {
        std::vector<QPDFExc> w = qpdf->qpdf->getWarnings();
        if (!w.empty()) {
            qpdf->warnings.assign(w.begin(), w.end());
        }
    }
    if (qpdf->warnings.empty()) {
        return QPDF_FALSE;
    } else {
        return QPDF_TRUE;
    }
}